

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  initializer_list<unsigned_int> init_list;
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  Operand *__args;
  IRContext *this_00;
  bool bVar6;
  Instruction *type_inst;
  iterator local_d0;
  undefined8 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  Operand local_98;
  uint32_t local_64;
  uint32_t local_60;
  uint32_t new_member_idx;
  uint32_t member_idx;
  uint32_t i_1;
  uint32_t i;
  bool modified;
  OperandList new_operands;
  uint32_t type_id;
  Instruction *object_inst;
  uint32_t object_id;
  uint32_t first_operand;
  Instruction *inst_local;
  EliminateDeadMembersPass *this_local;
  
  OVar1 = opt::Instruction::opcode(inst);
  bVar6 = true;
  if (OVar1 != OpCompositeExtract) {
    OVar1 = opt::Instruction::opcode(inst);
    bVar6 = false;
    if (OVar1 == OpSpecConstantOp) {
      uVar2 = opt::Instruction::GetSingleWordInOperand(inst,0);
      bVar6 = uVar2 == 0x51;
    }
  }
  if (!bVar6) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeExtract)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x22f,
                  "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
                 );
  }
  OVar1 = opt::Instruction::opcode(inst);
  object_inst._4_4_ = (uint32_t)(OVar1 == OpSpecConstantOp);
  uVar2 = opt::Instruction::GetSingleWordInOperand(inst,object_inst._4_4_);
  pDVar4 = Pass::get_def_use_mgr((Pass *)this);
  pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = opt::Instruction::type_id(pIVar5);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i);
  i_1._3_1_ = 0;
  for (member_idx = 0; member_idx < object_inst._4_4_ + 1; member_idx = member_idx + 1) {
    __args = opt::Instruction::GetInOperand(inst,member_idx);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spvtools::opt::Operand&>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&i,__args);
  }
  do {
    while( true ) {
      new_member_idx = object_inst._4_4_ + 1;
      uVar2 = new_member_idx;
      uVar3 = opt::Instruction::NumInOperands(inst);
      if (uVar3 <= uVar2) {
        bVar6 = (i_1._3_1_ & 1) != 0;
        if (bVar6) {
          opt::Instruction::SetInOperands(inst,(OperandList *)&i);
          this_00 = Pass::context((Pass *)this);
          IRContext::UpdateDefUse(this_00,inst);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i);
        return bVar6;
      }
      local_60 = opt::Instruction::GetSingleWordInOperand(inst,new_member_idx);
      local_64 = GetNewMemberIndex(this,new_operands.
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   local_60);
      if (local_64 == 0xffffffff) {
        __assert_fail("new_member_idx != kRemovedMember",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                      ,0x241,
                      "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
                     );
      }
      if (local_60 != local_64) {
        i_1._3_1_ = 1;
      }
      local_d0 = (iterator)((long)&type_inst + 4);
      local_c8 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_d0;
      type_inst._4_4_ = local_64;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,init_list);
      Operand::Operand(&local_98,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_c0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i,
                 &local_98);
      Operand::~Operand(&local_98);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c0);
      pDVar4 = Pass::get_def_use_mgr((Pass *)this);
      pIVar5 = analysis::DefUseManager::GetDef
                         (pDVar4,new_operands.
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      OVar1 = opt::Instruction::opcode(pIVar5);
      if ((1 < OVar1 - OpTypeVector) && (1 < OVar1 - OpTypeArray)) break;
LAB_00955b8c:
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           opt::Instruction::GetSingleWordInOperand(pIVar5,0);
      object_inst._4_4_ = new_member_idx;
    }
    if (OVar1 != OpTypeStruct) {
      if (((OVar1 != OpTypeCooperativeMatrixKHR) && (OVar1 != OpTypeCooperativeVectorNV)) &&
         (OVar1 != OpTypeCooperativeMatrixNV)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                      ,0x259,
                      "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
                     );
      }
      goto LAB_00955b8c;
    }
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         opt::Instruction::GetSingleWordInOperand(pIVar5,local_64);
    object_inst._4_4_ = new_member_idx;
  } while( true );
}

Assistant:

bool EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeExtract ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeExtract));

  uint32_t first_operand = 0;
  if (inst->opcode() == spv::Op::OpSpecConstantOp) {
    first_operand = 1;
  }
  uint32_t object_id = inst->GetSingleWordInOperand(first_operand);
  Instruction* object_inst = get_def_use_mgr()->GetDef(object_id);
  uint32_t type_id = object_inst->type_id();

  Instruction::OperandList new_operands;
  bool modified = false;
  for (uint32_t i = 0; i < first_operand + 1; i++) {
    new_operands.emplace_back(inst->GetInOperand(i));
  }
  for (uint32_t i = first_operand + 1; i < inst->NumInOperands(); ++i) {
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
    assert(new_member_idx != kRemovedMember);
    if (member_idx != new_member_idx) {
      modified = true;
    }
    new_operands.emplace_back(
        Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));

    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        // The type will have already been rewritten, so use the new member
        // index.
        type_id = type_inst->GetSingleWordInOperand(new_member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }

  if (!modified) {
    return false;
  }
  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}